

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *pMan,Vec_Ptr_t *vNodes)

{
  int iVar1;
  void *pvVar2;
  Nwk_Obj_t *pObj_00;
  int local_24;
  int i;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *vNodes_local;
  Nwk_Man_t *pMan_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vNodes);
    if (iVar1 <= local_24) {
      Nwk_ManIncrementTravId(pMan);
      for (local_24 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(pMan->vCos,local_24);
        iVar1 = Nwk_ManVerifyCut_rec(pObj_00);
        if (iVar1 == 0) {
          printf("Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.\n");
        }
      }
      for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes), local_24 < iVar1; local_24 = local_24 + 1) {
        pvVar2 = Vec_PtrEntry(vNodes,local_24);
        *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) & 0xffffffef;
      }
      return 1;
    }
    pvVar2 = Vec_PtrEntry(vNodes,local_24);
    if ((*(uint *)((long)pvVar2 + 0x20) >> 4 & 1) != 0) break;
    *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) & 0xffffffef | 0x10;
    local_24 = local_24 + 1;
  }
  __assert_fail("pObj->MarkA == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFlow.c"
                ,0x191,"int Nwk_ManRetimeVerifyCutForward(Nwk_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Nwk_ManRetimeVerifyCutForward( Nwk_Man_t * pMan, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pObj;
    int i;
    // mark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        pObj->MarkA = 1;
    }
    // traverse from the COs
    Nwk_ManIncrementTravId( pMan );
    Nwk_ManForEachCo( pMan, pObj, i )
        if ( !Nwk_ManVerifyCut_rec( pObj ) )
            printf( "Nwk_ManRetimeVerifyCutForward(): Internal cut verification failed.\n" );
    // unmark the nodes
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
        pObj->MarkA = 0;
    return 1;
}